

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O1

HT_TimelineListenerContainer * ht_registry_find_listener_container(char *name)

{
  char cVar1;
  uint32_t uVar2;
  HT_TimelineListenerContainer *pHVar3;
  uint32_t uVar4;
  char *pcVar5;
  ulong uVar6;
  
  cVar1 = *name;
  if (cVar1 == '\0') {
    uVar4 = 0x1505;
  }
  else {
    pcVar5 = name + 1;
    uVar4 = 0x1505;
    do {
      uVar4 = (int)cVar1 + uVar4 * 0x21;
      cVar1 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar1 != '\0');
  }
  ht_mutex_lock(listeners_register_mutex);
  if (listeners_register.size == 0) {
    pHVar3 = (HT_TimelineListenerContainer *)0x0;
  }
  else {
    pHVar3 = (HT_TimelineListenerContainer *)0x0;
    uVar6 = 0;
    do {
      uVar2 = ht_timeline_listener_container_get_id
                        ((HT_TimelineListenerContainer *)listeners_register.data[uVar6]);
      if (uVar2 == uVar4) {
        pHVar3 = (HT_TimelineListenerContainer *)listeners_register.data[uVar6];
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < listeners_register.size);
  }
  ht_mutex_unlock(listeners_register_mutex);
  return pHVar3;
}

Assistant:

HT_TimelineListenerContainer*
ht_registry_find_listener_container(const char* name)
{
    size_t i;
    uint32_t id = djb2_hash(name);

    ht_mutex_lock(listeners_register_mutex);
    for (i = 0; i < listeners_register.size; i++)
    {
        if (ht_timeline_listener_container_get_id((HT_TimelineListenerContainer*)listeners_register.data[i]) == id)
        {
            HT_TimelineListenerContainer* container = (HT_TimelineListenerContainer*)listeners_register.data[i];
            ht_mutex_unlock(listeners_register_mutex);
            return container;
        }
    }
    ht_mutex_unlock(listeners_register_mutex);

    return NULL;
}